

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_miniz.h
# Opt level: O2

void * buminiz::tdefl_write_image_to_png_file_in_memory_ex
                 (void *pImage,int w,int h,int num_chans,size_t *pLen_out,mz_uint level,mz_bool flip
                 )

{
  tdefl_compressor *__ptr;
  int iVar1;
  int iVar2;
  int iVar3;
  tdefl_status tVar4;
  mz_bool mVar5;
  tdefl_compressor *ptVar6;
  ulong uVar7;
  size_t sVar8;
  mz_ulong mVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int local_bc;
  tdefl_compressor *local_b8;
  int local_b0;
  int local_ac;
  tdefl_output_buffer out_buf;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined2 local_58;
  undefined1 uStack_56;
  undefined1 uStack_55;
  undefined2 uStack_54;
  undefined1 uStack_52;
  undefined1 uStack_51;
  undefined1 uStack_50;
  uint uStack_4f;
  undefined1 uStack_4b;
  undefined2 uStack_4a;
  undefined1 uStack_48;
  undefined1 uStack_47;
  undefined1 uStack_46;
  undefined1 uStack_45;
  undefined1 uStack_44;
  undefined4 uStack_43;
  
  ptVar6 = (tdefl_compressor *)malloc(0x4df78);
  *pLen_out = 0;
  if (ptVar6 != (tdefl_compressor *)0x0) {
    iVar1 = num_chans * w;
    out_buf.m_pBuf = (mz_uint8 *)0x0;
    out_buf.m_size = 0;
    out_buf.m_expandable = 1;
    out_buf._28_4_ = 0;
    iVar2 = (iVar1 + 1) * h;
    iVar11 = 0x40;
    if (0x40 < iVar2) {
      iVar11 = iVar2;
    }
    out_buf.m_capacity = (size_t)(iVar11 + 0x39);
    local_ac = w;
    out_buf.m_pBuf = (mz_uint8 *)malloc(out_buf.m_capacity);
    if (out_buf.m_pBuf != (mz_uint8 *)0x0) {
      local_b8 = ptVar6;
      local_b0 = num_chans;
      local_bc = 0x29;
      while (iVar11 = local_bc + -1, local_bc != 0) {
        tdefl_output_buffer_putter(&local_bc,1,&out_buf);
        local_bc = iVar11;
      }
      uVar7 = 10;
      if (level < 10) {
        uVar7 = (ulong)level;
      }
      tdefl_init(local_b8,tdefl_output_buffer_putter,&out_buf,
                 (uint)(level < 4) << 0xe |
                 tdefl_write_image_to_png_file_in_memory_ex::s_tdefl_png_num_probes[uVar7] | 0x1000)
      ;
      ptVar6 = local_b8;
      iVar2 = 0;
      iVar11 = 0;
      if (0 < h) {
        iVar11 = h;
      }
      iVar12 = h;
      for (; __ptr = local_b8, iVar12 = iVar12 + -1, iVar11 != iVar2; iVar2 = iVar2 + 1) {
        tdefl_compress_buffer(ptVar6,&local_bc,1,TDEFL_NO_FLUSH);
        iVar3 = iVar12;
        if (flip == 0) {
          iVar3 = iVar2;
        }
        tdefl_compress_buffer
                  (ptVar6,(void *)((long)(iVar3 * iVar1) + (long)pImage),(long)iVar1,TDEFL_NO_FLUSH)
        ;
      }
      tVar4 = tdefl_compress_buffer(local_b8,(void *)0x0,0,TDEFL_FINISH);
      if (tVar4 == TDEFL_STATUS_DONE) {
        sVar8 = out_buf.m_size - 0x29;
        *pLen_out = sVar8;
        local_68 = 0xa1a0a0d474e5089;
        uStack_60 = 0x524448490d000000;
        local_58 = 0;
        uStack_56 = (undefined1)((uint)local_ac >> 8);
        uStack_55 = (undefined1)local_ac;
        uStack_54 = 0;
        uStack_52 = (undefined1)((uint)h >> 8);
        uStack_51 = (undefined1)h;
        uStack_50 = 8;
        uStack_4f = (uint)""[local_b0];
        uStack_4b = 0;
        uStack_4a = 0;
        uStack_48 = 0;
        uStack_47 = (undefined1)(sVar8 >> 0x18);
        uStack_46 = (undefined1)(sVar8 >> 0x10);
        uStack_45 = (undefined1)(sVar8 >> 8);
        uStack_44 = (undefined1)sVar8;
        uStack_43 = 0x54414449;
        mVar9 = mz_crc32(0,(mz_uint8 *)((long)&uStack_60 + 4),0x11);
        for (lVar10 = 0x1d; lVar10 != 0x21; lVar10 = lVar10 + 1) {
          *(char *)((long)&local_68 + lVar10) = (char)(mVar9 >> 0x18);
          mVar9 = (mz_ulong)(uint)((int)mVar9 << 8);
        }
        *(ulong *)(out_buf.m_pBuf + 0x19) =
             CONCAT17(uStack_48,CONCAT25(uStack_4a,CONCAT14(uStack_4b,uStack_4f)));
        *(ulong *)(out_buf.m_pBuf + 0x21) =
             CONCAT44(uStack_43,
                      CONCAT13(uStack_44,CONCAT12(uStack_45,CONCAT11(uStack_46,uStack_47))));
        *(ulong *)(out_buf.m_pBuf + 0x10) =
             CONCAT17(uStack_51,
                      CONCAT16(uStack_52,
                               CONCAT24(uStack_54,CONCAT13(uStack_55,CONCAT12(uStack_56,local_58))))
                     );
        *(ulong *)(out_buf.m_pBuf + 0x18) =
             CONCAT26(uStack_4a,CONCAT15(uStack_4b,CONCAT41(uStack_4f,uStack_50)));
        *(undefined8 *)out_buf.m_pBuf = local_68;
        *(undefined8 *)(out_buf.m_pBuf + 8) = uStack_60;
        mVar5 = tdefl_output_buffer_putter("",0x10,&out_buf);
        if (mVar5 != 0) {
          mVar9 = mz_crc32(0,out_buf.m_pBuf + 0x25,*pLen_out + 4);
          for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
            out_buf.m_pBuf[lVar10 + -0x10 + out_buf.m_size] = (mz_uint8)(mVar9 >> 0x18);
            mVar9 = (mz_ulong)(uint)((int)mVar9 << 8);
          }
          *pLen_out = *pLen_out + 0x39;
          free(__ptr);
          return out_buf.m_pBuf;
        }
        *pLen_out = 0;
      }
      free(__ptr);
      ptVar6 = (tdefl_compressor *)out_buf.m_pBuf;
    }
    free(ptVar6);
  }
  return (void *)0x0;
}

Assistant:

void *tdefl_write_image_to_png_file_in_memory_ex(const void *pImage, int w, int h, int num_chans, size_t *pLen_out, mz_uint level, mz_bool flip)
{
  // Using a local copy of this array here in case MINIZ_NO_ZLIB_APIS was defined.
  static const mz_uint s_tdefl_png_num_probes[11] = { 0, 1, 6, 32,  16, 32, 128, 256,  512, 768, 1500 };
  tdefl_compressor *pComp = (tdefl_compressor *)MZ_MALLOC(sizeof(tdefl_compressor)); tdefl_output_buffer out_buf; int i, bpl = w * num_chans, y, z; mz_uint32 c; *pLen_out = 0;
  if (!pComp) return NULL;
  MZ_CLEAR_OBJ(out_buf); out_buf.m_expandable = MZ_TRUE; out_buf.m_capacity = 57+MZ_MAX(64, (1+bpl)*h); if (NULL == (out_buf.m_pBuf = (mz_uint8*)MZ_MALLOC(out_buf.m_capacity))) { MZ_FREE(pComp); return NULL; }
  // write dummy header
  for (z = 41; z; --z) tdefl_output_buffer_putter(&z, 1, &out_buf);
  // compress image data
  tdefl_init(pComp, tdefl_output_buffer_putter, &out_buf, s_tdefl_png_num_probes[MZ_MIN(10, level)] | TDEFL_WRITE_ZLIB_HEADER | (level <= 3 ? TDEFL_GREEDY_PARSING_FLAG : 0));
  for (y = 0; y < h; ++y) { tdefl_compress_buffer(pComp, &z, 1, TDEFL_NO_FLUSH); tdefl_compress_buffer(pComp, (mz_uint8*)pImage + (flip ? (h - 1 - y) : y) * bpl, bpl, TDEFL_NO_FLUSH); }
  if (tdefl_compress_buffer(pComp, NULL, 0, TDEFL_FINISH) != TDEFL_STATUS_DONE) { MZ_FREE(pComp); MZ_FREE(out_buf.m_pBuf); return NULL; }
  // write real header
  *pLen_out = out_buf.m_size-41;
  {
    static const mz_uint8 chans[] = {0x00, 0x00, 0x04, 0x02, 0x06};
    mz_uint8 pnghdr[41]={0x89,0x50,0x4e,0x47,0x0d,0x0a,0x1a,0x0a,0x00,0x00,0x00,0x0d,0x49,0x48,0x44,0x52,
      0,0,(mz_uint8)(w>>8),(mz_uint8)w,0,0,(mz_uint8)(h>>8),(mz_uint8)h,8,chans[num_chans],0,0,0,0,0,0,0,
      (mz_uint8)(*pLen_out>>24),(mz_uint8)(*pLen_out>>16),(mz_uint8)(*pLen_out>>8),(mz_uint8)*pLen_out,0x49,0x44,0x41,0x54};
    c=(mz_uint32)mz_crc32(MZ_CRC32_INIT,pnghdr+12,17); for (i=0; i<4; ++i, c<<=8) ((mz_uint8*)(pnghdr+29))[i]=(mz_uint8)(c>>24);
    memcpy(out_buf.m_pBuf, pnghdr, 41);
  }
  // write footer (IDAT CRC-32, followed by IEND chunk)
  if (!tdefl_output_buffer_putter("\0\0\0\0\0\0\0\0\x49\x45\x4e\x44\xae\x42\x60\x82", 16, &out_buf)) { *pLen_out = 0; MZ_FREE(pComp); MZ_FREE(out_buf.m_pBuf); return NULL; }
  c = (mz_uint32)mz_crc32(MZ_CRC32_INIT,out_buf.m_pBuf+41-4, *pLen_out+4); for (i=0; i<4; ++i, c<<=8) (out_buf.m_pBuf+out_buf.m_size-16)[i] = (mz_uint8)(c >> 24);
  // compute final size of file, grab compressed data buffer and return
  *pLen_out += 57; MZ_FREE(pComp); return out_buf.m_pBuf;
}